

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O1

bool HasCryptFilterDefinition(PDFParser *inParser,PDFStreamInput *inStream)

{
  PDFObject *this;
  EPDFObjectType EVar1;
  int iVar2;
  PDFDictionary *inDictionary;
  unsigned_long uVar3;
  PDFObject *inOriginal;
  PDFName *this_00;
  string *psVar4;
  ulong i;
  bool bVar5;
  RefCountPtr<PDFObject> filterObject;
  PDFObjectCastPtr<PDFName> filterObjectItem;
  RefCountPtr<PDFDictionary> streamDictionary;
  RefCountPtr<PDFObject> local_70;
  string local_60;
  RefCountPtr<PDFDictionary> local_40;
  
  inDictionary = PDFStreamInput::QueryStreamDictionary(inStream);
  local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9720;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40.mValue = inDictionary;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Filter","");
  local_70.mValue = PDFParser::QueryDictionaryObject(inParser,inDictionary,&local_60);
  local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((PDFName *)local_70.mValue != (PDFName *)0x0) {
    EVar1 = PDFObject::GetType(local_70.mValue);
    this = local_70.mValue;
    if (EVar1 == ePDFObjectArray) {
      bVar5 = false;
      i = 0;
      do {
        uVar3 = PDFArray::GetLength((PDFArray *)this);
        if ((uVar3 <= i) || (bVar5)) break;
        inOriginal = PDFArray::QueryObject((PDFArray *)this,i);
        this_00 = PDFObjectCast<PDFName>(inOriginal);
        local_60._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a9888;
        local_60._M_string_length = (size_type)this_00;
        if (this_00 != (PDFName *)0x0) {
          psVar4 = PDFName::GetValue_abi_cxx11_(this_00);
          iVar2 = std::__cxx11::string::compare((char *)psVar4);
          bVar5 = iVar2 == 0;
        }
        RefCountPtr<PDFName>::~RefCountPtr((RefCountPtr<PDFName> *)&local_60);
        i = i + 1;
      } while (this_00 != (PDFName *)0x0);
      goto LAB_002070fc;
    }
    EVar1 = PDFObject::GetType(local_70.mValue);
    if (EVar1 == ePDFObjectName) {
      psVar4 = PDFName::GetValue_abi_cxx11_((PDFName *)local_70.mValue);
      iVar2 = std::__cxx11::string::compare((char *)psVar4);
      bVar5 = iVar2 == 0;
      goto LAB_002070fc;
    }
  }
  bVar5 = false;
LAB_002070fc:
  RefCountPtr<PDFObject>::~RefCountPtr(&local_70);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_40);
  return bVar5;
}

Assistant:

bool HasCryptFilterDefinition(PDFParser* inParser, PDFStreamInput* inStream) {
	RefCountPtr<PDFDictionary> streamDictionary(inStream->QueryStreamDictionary());

	// check if stream has a crypt filter
	RefCountPtr<PDFObject> filterObject(inParser->QueryDictionaryObject(streamDictionary.GetPtr(), "Filter"));
	if (!filterObject)
	{
		// no filter, so stop here
		return false;
	}

	if (filterObject->GetType() == PDFObject::ePDFObjectArray)
	{
		PDFArray* filterObjectArray = (PDFArray*)filterObject.GetPtr();
		bool foundCrypt = false;
		for (unsigned long i = 0; i < filterObjectArray->GetLength() && !foundCrypt; ++i)
		{
			PDFObjectCastPtr<PDFName> filterObjectItem(filterObjectArray->QueryObject(i));
			if (!filterObjectItem)
			{
				// error
				break;
			}
			foundCrypt = filterObjectItem->GetValue() == "Crypt";
		}
		return foundCrypt;
	}
	else if (filterObject->GetType() == PDFObject::ePDFObjectName)
	{
		return ((PDFName*)(filterObject.GetPtr()))->GetValue() == "Crypt";
	}
	else
		return false; //???
}